

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O1

void __thiscall
r_exec::CSTController::abduce(CSTController *this,HLPBindingMap *bm,Fact *super_goal)

{
  Sim *sim;
  bool bVar1;
  byte bVar2;
  short sVar3;
  undefined2 uVar4;
  int iVar5;
  MatchResult MVar6;
  Goal *this_00;
  _Fact *this_01;
  undefined4 extraout_var;
  long *plVar7;
  Group *group;
  uint64_t now;
  Code *pCVar8;
  ushort uVar9;
  float fVar10;
  _Fact *evidence;
  _Fact *local_38;
  
  this_00 = _Fact::get_goal(&super_goal->super__Fact);
  this_01 = Goal::get_target(this_00);
  bVar1 = _Fact::is_anti_fact(this_01);
  fVar10 = _Fact::get_cfd(this_01);
  sim = (Sim *)(this_00->sim).object;
  iVar5 = (*(this->super_HLPController).super_OController.super_Controller.super__Object.
            _vptr__Object[4])(this);
  plVar7 = (long *)CONCAT44(extraout_var,iVar5);
  sVar3 = (**(code **)(*plVar7 + 0x50))(plVar7);
  plVar7 = (long *)(**(code **)(*plVar7 + 0x48))(plVar7,sVar3 + -1);
  (**(code **)(*plVar7 + 0x20))(plVar7,2);
  sVar3 = r_code::Atom::asIndex();
  (**(code **)(*plVar7 + 0x20))(plVar7,sVar3);
  bVar2 = r_code::Atom::getAtomCount();
  group = r_exec::View::get_host
                    ((View *)(this->super_HLPController).super_OController.super_Controller.view);
  now = (*Now)();
  if (bVar2 != 0) {
    uVar9 = (ushort)bVar2;
    do {
      sVar3 = sVar3 + 1;
      (**(code **)(*plVar7 + 0x20))(plVar7,sVar3);
      uVar4 = r_code::Atom::asIndex();
      pCVar8 = (Code *)(**(code **)(*plVar7 + 0x48))(plVar7,uVar4);
      pCVar8 = HLPBindingMap::bind_pattern(bm,pCVar8);
      if (bVar1) {
        _Fact::set_opposite((_Fact *)pCVar8);
      }
      MVar6 = HLPController::check_evidences(&this->super_HLPController,(_Fact *)pCVar8,&local_38);
      if (MVar6 == MATCH_FAILURE) {
        MVar6 = HLPController::check_predicted_evidences
                          (&this->super_HLPController,(_Fact *)pCVar8,&local_38);
        if (MVar6 - MATCH_SUCCESS_NEGATIVE < 2) {
          inject_goal(this,bm,super_goal,(_Fact *)pCVar8,sim,now,(double)fVar10,(Code *)group);
        }
      }
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void CSTController::abduce(HLPBindingMap *bm, Fact *super_goal)   // super_goal is f0->g->f1->icst or f0->g->|f1->icst.
{
    Goal *g = super_goal->get_goal();
    _Fact *super_goal_target = g->get_target();
    bool opposite = (super_goal_target->is_anti_fact());
    double confidence = super_goal_target->get_cfd();
    Sim *sim = g->sim;
    Code *cst = get_unpacked_object();
    uint16_t obj_set_index = cst->code(CST_OBJS).asIndex();
    uint16_t obj_count = cst->code(obj_set_index).getAtomCount();
    Group *host = get_host();
    uint64_t now = Now();

    for (uint16_t i = 1; i <= obj_count; ++i) {
        _Fact *pattern = (_Fact *)cst->get_reference(cst->code(obj_set_index + i).asIndex());
        _Fact *bound_pattern = (_Fact *)bm->bind_pattern(pattern);
        _Fact *evidence;

        if (opposite) {
            bound_pattern->set_opposite();
        }

        switch (check_evidences(bound_pattern, evidence)) {
        case MATCH_SUCCESS_POSITIVE: // positive evidence, no need to produce a sub-goal: skip.
            break;

        case MATCH_SUCCESS_NEGATIVE: // negative evidence, no need to produce a sub-goal, the super-goal will probably fail within the target time frame: skip.
            break;

        case MATCH_FAILURE:
            switch (check_predicted_evidences(bound_pattern, evidence)) {
            case MATCH_SUCCESS_POSITIVE:
                break;

            case MATCH_SUCCESS_NEGATIVE:
            case MATCH_FAILURE: // inject a sub-goal for the missing predicted positive evidence.
                inject_goal(bm, super_goal, bound_pattern, sim, now, confidence, host); // all sub-goals share the same sim.
                break;
            }
        }
    }
}